

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Model::set_allocated_wordembedding(Model *this,WordEmbedding *wordembedding)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (wordembedding != (WordEmbedding *)0x0) {
    uVar1 = (wordembedding->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      wordembedding =
           (WordEmbedding *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&wordembedding->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x7d5;
    (this->Type_).wordembedding_ = wordembedding;
  }
  return;
}

Assistant:

void Model::set_allocated_wordembedding(::CoreML::Specification::CoreMLModels::WordEmbedding* wordembedding) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (wordembedding) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(wordembedding));
    if (message_arena != submessage_arena) {
      wordembedding = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, wordembedding, submessage_arena);
    }
    set_has_wordembedding();
    Type_.wordembedding_ = wordembedding;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.wordEmbedding)
}